

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesXPath.cpp
# Opt level: O1

XMLSize_t __thiscall
xercesc_4_0::XPathScanner::scanNumber
          (XPathScanner *this,XMLCh *data,XMLSize_t endOffset,XMLSize_t currentOffset,
          ValueVectorOf<int> *tokens)

{
  XMLCh XVar1;
  XMLSize_t XVar2;
  RuntimeException *this_00;
  int iVar3;
  XMLSize_t XVar4;
  ulong uVar5;
  int iVar6;
  
  iVar6 = 0;
  do {
    XVar1 = data[currentOffset];
    XVar4 = currentOffset;
    if (9 < (ushort)(XVar1 + L'￐')) break;
    iVar6 = (uint)(ushort)XVar1 + iVar6 * 10 + -0x30;
    currentOffset = currentOffset + 1;
    XVar4 = endOffset;
  } while (endOffset != currentOffset);
  iVar3 = 0;
  if (((ushort)XVar1 == 0x2e) && (XVar4 = XVar4 + 1, iVar3 = 0, XVar4 < endOffset)) {
    iVar3 = 0;
    uVar5 = XVar4;
    do {
      XVar4 = uVar5;
      if (9 < (ushort)(data[uVar5] + L'￐')) break;
      iVar3 = (uint)(ushort)data[uVar5] + iVar3 * 10 + -0x30;
      uVar5 = uVar5 + 1;
      XVar4 = endOffset;
    } while (endOffset != uVar5);
    if (iVar3 != 0) {
      this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
      RuntimeException::RuntimeException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                 ,0x580,XPath_FindSolution,tokens->fMemoryManager);
      __cxa_throw(this_00,&RuntimeException::typeinfo,XMLException::~XMLException);
    }
  }
  ValueVectorOf<int>::ensureExtraCapacity(tokens,1);
  XVar2 = tokens->fCurCount;
  tokens->fCurCount = XVar2 + 1;
  tokens->fElemList[XVar2] = iVar6;
  ValueVectorOf<int>::ensureExtraCapacity(tokens,1);
  XVar2 = tokens->fCurCount;
  tokens->fCurCount = XVar2 + 1;
  tokens->fElemList[XVar2] = iVar3;
  return XVar4;
}

Assistant:

XMLSize_t XPathScanner::scanNumber(const XMLCh* const data,
                             const XMLSize_t endOffset,
                             XMLSize_t currentOffset,
                             ValueVectorOf<int>* const tokens) {

    XMLCh ch = data[currentOffset];
    int   whole = 0;
    int   part = 0;

    while (ch >= chDigit_0 && ch <= chDigit_9) {

        whole = (whole * 10) + (ch - chDigit_0);

        if (++currentOffset == endOffset) {
            break;
        }

        ch = data[currentOffset];
    }

    if (ch == chPeriod) {

        if (++currentOffset < endOffset) {

            ch = data[currentOffset];

            while (ch >= chDigit_0 && ch <= chDigit_9) {

                part = (part * 10) + (ch - chDigit_0);

                if (++currentOffset == endOffset) {
                    break;
                }

                ch = data[currentOffset];
            }

            if (part != 0) {
                ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::XPath_FindSolution, tokens->getMemoryManager());
            }
        }
    }

    tokens->addElement(whole);
    tokens->addElement(part);

    return currentOffset;
}